

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall
ClipperLib::Clipper::FixupFirstLefts1(Clipper *this,OutRec *OldOutRec,OutRec *NewOutRec)

{
  _func_int **pp_Var1;
  long lVar2;
  OutPt *op_00;
  int iVar3;
  long lVar4;
  OutRec *pOVar5;
  _func_int *p_Var6;
  ulong uVar7;
  OutPt *op;
  long lVar8;
  
  pp_Var1 = this->_vptr_Clipper;
  p_Var6 = pp_Var1[-3];
  lVar4 = *(long *)((long)&this->m_ClipType + (long)p_Var6);
  if (*(long *)(p_Var6 + (long)&(this->m_Maxima).
                                super__List_base<long_long,_std::allocator<long_long>_>) != lVar4) {
    uVar7 = 0;
    do {
      lVar4 = *(long *)(lVar4 + uVar7 * 8);
      for (pOVar5 = *(OutRec **)(lVar4 + 8); pOVar5 != (OutRec *)0x0; pOVar5 = pOVar5->FirstLeft) {
        if (pOVar5->Pts != (OutPt *)0x0) goto LAB_00113bd2;
      }
      pOVar5 = (OutRec *)0x0;
LAB_00113bd2:
      lVar2 = *(long *)(lVar4 + 0x18);
      if (pOVar5 == OldOutRec && lVar2 != 0) {
        op_00 = NewOutRec->Pts;
        lVar8 = lVar2;
        do {
          iVar3 = PointInPolygon((IntPoint *)(lVar8 + 8),op_00);
          if (-1 < iVar3) {
            if (iVar3 == 0) goto LAB_00113c23;
            break;
          }
          lVar8 = *(long *)(lVar8 + 0x18);
        } while (lVar8 != lVar2);
        *(OutRec **)(lVar4 + 8) = NewOutRec;
        p_Var6 = pp_Var1[-3];
      }
LAB_00113c23:
      uVar7 = uVar7 + 1;
      lVar4 = *(long *)((long)&this->m_ClipType + (long)p_Var6);
    } while (uVar7 < (ulong)(*(long *)(p_Var6 + (long)&(this->m_Maxima).
                                                                                                              
                                                  super__List_base<long_long,_std::allocator<long_long>_>
                                      ) - lVar4 >> 3));
  }
  return;
}

Assistant:

void Clipper::FixupFirstLefts1(OutRec* OldOutRec, OutRec* NewOutRec)
{ 
  //tests if NewOutRec contains the polygon before reassigning FirstLeft
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
  {
    OutRec* outRec = m_PolyOuts[i];
    OutRec* firstLeft = ParseFirstLeft(outRec->FirstLeft);
    if (outRec->Pts  && firstLeft == OldOutRec)
    {
      if (Poly2ContainsPoly1(outRec->Pts, NewOutRec->Pts))
        outRec->FirstLeft = NewOutRec;
    }
  }
}